

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usda-writer.cc
# Opt level: O3

bool tinyusdz::usda::SaveAsUSDA(string *filename,Stage *stage,string *warn,string *err)

{
  bool bVar1;
  ostream *poVar2;
  string s;
  string local_38;
  
  Stage::ExportToString_abi_cxx11_(&local_38,stage,false);
  bVar1 = io::WriteWholeFile(filename,(uchar *)local_38._M_dataplus._M_p,local_38._M_string_length,
                             err);
  if (bVar1) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Wrote to [",10);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,(filename->_M_dataplus)._M_p,
                        filename->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"]\n",2);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  return bVar1;
}

Assistant:

bool SaveAsUSDA(const std::string &filename, const Stage &stage,
                std::string *warn, std::string *err) {

  (void)warn;

  // TODO: Handle warn and err on export.
  std::string s = stage.ExportToString();

  if (!io::WriteWholeFile(filename, reinterpret_cast<const unsigned char *>(s.data()), s.size(), err)) {
    return false;
  }

  std::cout << "Wrote to [" << filename << "]\n";

  return true;
}